

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Syndication_Init.cpp
# Opt level: O3

bool __thiscall
SRUP_MSG_SYNDICATION_INIT::DeSerialize(SRUP_MSG_SYNDICATION_INIT *this,uint8_t *serial_data)

{
  uint64_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  undefined8 in_RAX;
  uint64_t *puVar4;
  uint8_t *puVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  char *__salt;
  uint8_t bytes [2];
  undefined8 uStack_38;
  
  *(this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_version = *serial_data;
  *(this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_msgtype = serial_data[1];
  uVar1 = *(uint64_t *)(serial_data + 2);
  puVar4 = (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_sequence_ID;
  uStack_38 = in_RAX;
  if (puVar4 != (uint64_t *)0x0) {
    operator_delete(puVar4);
  }
  puVar4 = (uint64_t *)operator_new(8);
  (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_sequence_ID = puVar4;
  *puVar4 = uVar1;
  uVar1 = *(uint64_t *)(serial_data + 10);
  puVar4 = (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_sender_ID;
  if (puVar4 != (uint64_t *)0x0) {
    operator_delete(puVar4);
  }
  puVar4 = (uint64_t *)operator_new(8);
  (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_sender_ID = puVar4;
  *puVar4 = uVar1;
  uStack_38 = CONCAT26(*(undefined2 *)(serial_data + 0x12),(undefined6)uStack_38);
  uVar2 = SRUP_MSG::decodeLength((uint8_t *)((long)&uStack_38 + 6));
  puVar5 = (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_token;
  if (puVar5 != (uint8_t *)0x0) {
    operator_delete__(puVar5);
  }
  uVar7 = (ulong)uVar2;
  puVar5 = (uint8_t *)operator_new__(uVar7);
  (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_token = puVar5;
  memcpy(puVar5,serial_data + 0x14,uVar7);
  (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_token_len = uVar2;
  uStack_38 = CONCAT26(*(undefined2 *)(serial_data + uVar7 + 0x14),(undefined6)uStack_38);
  uVar3 = SRUP_MSG::decodeLength((uint8_t *)((long)&uStack_38 + 6));
  (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_sig_len = uVar3;
  puVar5 = (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_signature;
  if (puVar5 != (uint8_t *)0x0) {
    operator_delete__(puVar5);
  }
  uVar7 = (ulong)uVar3;
  puVar5 = (uint8_t *)operator_new__(uVar7);
  (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_signature = puVar5;
  memcpy(puVar5,serial_data + (uVar2 + 0x16),uVar7);
  lVar8 = (uVar2 + 0x16) + uVar7;
  uStack_38 = CONCAT26(*(undefined2 *)(serial_data + lVar8),(undefined6)uStack_38);
  uVar2 = SRUP_MSG::decodeLength((uint8_t *)((long)&uStack_38 + 6));
  if (this->m_url != (char *)0x0) {
    operator_delete__(this->m_url);
  }
  uVar7 = (ulong)uVar2;
  pcVar6 = (char *)operator_new__((ulong)(uVar2 + 1));
  this->m_url = pcVar6;
  memcpy(pcVar6,serial_data + lVar8 + 2,uVar7);
  pcVar6[uVar7] = '\0';
  this->m_url_len = uVar2;
  uStack_38 = CONCAT26(*(undefined2 *)(serial_data + uVar7 + lVar8 + 4 + -2),(undefined6)uStack_38);
  uVar2 = SRUP_MSG::decodeLength((uint8_t *)((long)&uStack_38 + 6));
  __salt = (char *)(ulong)uVar2;
  pcVar6 = (char *)operator_new__((ulong)__salt);
  memcpy(pcVar6,serial_data + uVar7 + lVar8 + 4,(size_t)__salt);
  SRUP_Crypto::crypt((this->super_SRUP_MSG_OBS_BASE).m_crypto,pcVar6,__salt);
  operator_delete__(pcVar6);
  return true;
}

Assistant:

bool SRUP_MSG_SYNDICATION_INIT::DeSerialize (const uint8_t *serial_data)
{
    uint16_t x;
    uint32_t p=0;
    uint8_t bytes[2];

    // We need to unmarshall the data to reconstruct the object...
    // We can start with the two bytes for the header.
    // One for the version - and one for the message type.

    std::memcpy(m_version, (uint8_t*) serial_data, 1);
    p+=1;
    std::memcpy(m_msgtype, (uint8_t*) serial_data + p, 1);
    p+=1;

    // Now we have to unmarshall the sequence ID...
    // Reconstructing it from the 8x uint8_t's we have in the bytestream...
    // First we get the 8-bytes...
    uint8_t sid_bytes[8];
    for (unsigned char & sid_byte : sid_bytes)
    {
        std::memcpy(&sid_byte, (uint8_t*) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into m_sequence_ID
    if (m_sequence_ID != nullptr)
        delete(m_sequence_ID);
    m_sequence_ID = new uint64_t;
    std::memcpy(m_sequence_ID, sid_bytes, 8);

    // Again we have to do the same trick to unmarshall the sender ID...
    // Reconstructing it from the 8x uint8_t's we have in the bytestream...
    uint8_t snd_bytes[8];
    for (unsigned char & snd_byte : snd_bytes)
    {
        std::memcpy(&snd_byte, (uint8_t*) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into m_sender_ID
    if (m_sender_ID != nullptr)
        delete(m_sender_ID);
    m_sender_ID = new uint64_t;
    std::memcpy(m_sender_ID, snd_bytes, 8);

    // Now the token - the last of the "generic" fields...
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;
    delete[] m_token;
    m_token = new uint8_t[x];
    std::memcpy(m_token, (uint8_t *) serial_data + p, x);
    m_token_len = x;
    p+=x;

    // Most of the rest of the fields are simpler...

    // The next two bytes are the size of the signature...
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;

    m_sig_len = x;

    // The next x bytes are the value of the signature.
    delete[] m_signature;
    m_signature = new uint8_t[x];
    std::memcpy(m_signature, serial_data + p, x);

    p+=x;

    // Now finally on to the remaining (simple) fields...
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;
    delete[] m_url;
    m_url = new char[x+1];
    std::memcpy(m_url, (uint8_t *) serial_data + p, x);
    *(m_url + x) = 0;
    m_url_len = x;
    p+=x;

    // Lastly we have the encrypted data.
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;

    auto* encrypted_data = new uint8_t[x];

    std::memcpy(encrypted_data, (uint8_t *) serial_data + p, x);
    m_crypto->crypt(encrypted_data, x);

    delete[] encrypted_data;

    return true;
}